

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  TPZVec<double> *in_RDI;
  REAL lmaymez;
  REAL lmaxmez;
  REAL lmeymez;
  REAL lmexmez;
  REAL lmez;
  REAL T1yz;
  REAL T1xz;
  REAL T0yz;
  REAL T0xz;
  int64_t in_stack_fffffffffffffed0;
  double col;
  int64_t in_stack_fffffffffffffed8;
  double row;
  TPZFMatrix<double> *in_stack_fffffffffffffee0;
  TPZFMatrix<double> *this;
  
  pdVar6 = TPZVec<double>::operator[](in_RDI,0);
  if ((ABS(*pdVar6) < 1e-10) &&
     (pdVar6 = TPZVec<double>::operator[](in_RDI,1), ABS(*pdVar6) < 1e-10)) {
    pdVar6 = TPZVec<double>::operator[](in_RDI,2);
    if ((*pdVar6 == 1.0) && (!NAN(*pdVar6))) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 1.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = -0.25;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 0.0;
      pdVar6 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed0);
      *pdVar6 = 1.0;
      return;
    }
  }
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,0);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar3 = (((1.0 - dVar1) - dVar2) * 0.5) / (1.0 - *pdVar6);
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,1);
  col = ((1.0 - dVar1) - *pdVar6) * 0.5;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = col / (1.0 - *pdVar6);
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  row = 1.0 - *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,0);
  this = (TPZFMatrix<double> *)((row + *pdVar6) * 0.5);
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar5 = (double)this / (1.0 - *pdVar6);
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,1);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = (((1.0 - dVar1) + dVar2) * 0.5) / (1.0 - *pdVar6);
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar2 = 1.0 - *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = dVar3 * dVar4 * dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = dVar5 * dVar4 * dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = dVar5 * dVar1 * dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = dVar3 * dVar1 * dVar2;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = dVar1;
  pdVar6 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar3 = (1.0 - dVar1) - *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = (1.0 - dVar1) - *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar5 = (dVar1 + 1.0) - *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = (dVar1 + 1.0) - *pdVar6;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar4 * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar3 * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (((dVar4 + dVar3) - (dVar3 * dVar4) / dVar2) * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar4 * 0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar5 * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (((dVar4 + dVar5) - (dVar5 * dVar4) / dVar2) * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar1 * 0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar5 * 0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (((dVar1 + dVar5) - (dVar5 * dVar1) / dVar2) * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar1 * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (dVar3 * 0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = (((dVar1 + dVar3) - (dVar3 * dVar1) / dVar2) * -0.25) / dVar2;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = 0.0;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = 0.0;
  pdVar6 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar6 = 1.0;
  return;
}

Assistant:

void TPZShapePiram::ShapeCorner(const TPZVec<REAL> &pt,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        if(fabs(pt[0])<1.e-10 && fabs(pt[1])<1.e-10 && pt[2]==1.) {
            //para testes com transformaçoes geometricas-->>Que é o que faz o RefPattern!!
            //(0,0,1) nunca é um ponto de integração
            phi(0,0)  = 0.;
            phi(1,0)  = 0.;
            phi(2,0)  = 0.;
            phi(3,0)  = 0.;
            phi(4,0)  = 1.;
            dphi(0,0)  = -0.25;
            dphi(1,0)  = -0.25;
            dphi(2,0)  = -0.25;
            dphi(0,1)  = 0.25;
            dphi(1,1)  = -0.25;
            dphi(2,1)  = -0.25;
            dphi(0,2)  = 0.25;
            dphi(1,2)  = 0.25;
            dphi(2,2)  = -0.25;
            dphi(0,3)  = -0.25;
            dphi(1,3)  = 0.25;
            dphi(2,3)  = -0.25;
            dphi(0,4)  = 0;
            dphi(1,4)  = 0;
            dphi(2,4)  = 1.;
            
            
            
            return;
        }
        
        REAL T0xz = .5*(1.-pt[2]-pt[0]) / (1.-pt[2]);
        REAL T0yz = .5*(1.-pt[2]-pt[1]) / (1.-pt[2]);
        REAL T1xz = .5*(1.-pt[2]+pt[0]) / (1.-pt[2]);
        REAL T1yz = .5*(1.-pt[2]+pt[1]) / (1.-pt[2]);
        REAL lmez = (1.-pt[2]);
        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = pt[2];
        REAL lmexmez = 1.-pt[0]-pt[2];
        REAL lmeymez = 1.-pt[1]-pt[2];
        REAL lmaxmez = 1.+pt[0]-pt[2];
        REAL lmaymez = 1.+pt[1]-pt[2];
        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;
    }